

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

void * arkStep_GetLmem(ARKodeMem ark_mem)

{
  void *pvVar1;
  
  if (ark_mem->step_mem == (void *)0x0) {
    pvVar1 = (void *)0x0;
    arkProcessError(ark_mem,-0x15,0x9a4,"arkStep_GetLmem",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    pvVar1 = *(void **)((long)ark_mem->step_mem + 0x140);
  }
  return pvVar1;
}

Assistant:

int arkStep_AccessStepMem(ARKodeMem ark_mem, const char* fname,
                          ARKodeARKStepMem* step_mem)
{
  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  *step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  return (ARK_SUCCESS);
}